

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btGjkEpa2.cpp
# Opt level: O2

btScalar gjkepa2_impl::GJK::projectorigin
                   (btVector3 *a,btVector3 *b,btVector3 *c,btVector3 *d,btScalar *w,U *m)

{
  uint uVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  U *pUVar4;
  btVector3 *a_00;
  U i;
  long lVar5;
  btScalar bVar6;
  btScalar bVar7;
  btVector3 bVar8;
  btScalar local_d0;
  btScalar subw [3];
  btScalar bStack_b4;
  U subm;
  undefined1 auStack_94 [12];
  btVector3 *vt [4];
  btVector3 dl [3];
  
  vt[0] = a;
  vt[1] = b;
  vt[2] = c;
  vt[3] = d;
  dl[0] = operator-(a,d);
  dl[1] = operator-(b,d);
  dl[2] = operator-(c,d);
  a_00 = dl;
  bVar6 = det(a_00,dl + 1,dl + 2);
  _subw = operator-(b,c);
  _subm = operator-(a,b);
  bVar8 = btVector3::cross((btVector3 *)subw,(btVector3 *)&subm);
  local_d0 = -1.0;
  if ((bVar6 != 0.0) &&
     ((bVar8.m_floats[2] * a->m_floats[2] +
      a->m_floats[0] * bVar8.m_floats[0] + bVar8.m_floats[1] * a->m_floats[1]) * bVar6 <= 0.0)) {
    subw[2] = 0.0;
    auVar2._8_8_ = 0;
    auVar2._0_8_ = stack0xffffffffffffff48;
    _subw = (btScalar  [4])(auVar2 << 0x40);
    auVar3._12_4_ = 0;
    auVar3._0_12_ = auStack_94;
    _subm = (btScalar  [4])(auVar3 << 0x20);
    local_d0 = -1.0;
    pUVar4 = projectorigin::imd3;
    for (lVar5 = 0; lVar5 != 3; lVar5 = lVar5 + 1) {
      uVar1 = *pUVar4;
      bVar8 = btVector3::cross(a_00,dl + uVar1);
      if (0.0 < (bVar8.m_floats[2] * d->m_floats[2] +
                d->m_floats[0] * bVar8.m_floats[0] + bVar8.m_floats[1] * d->m_floats[1]) * bVar6) {
        bVar7 = projectorigin(vt[lVar5],vt[uVar1],d,subw,&subm);
        if ((local_d0 < 0.0) || (bVar7 < local_d0)) {
          *m = (1 << ((byte)uVar1 & 0x1f) & (int)(subm << 0x1e) >> 0x1f) + (subm & 4) * 2 +
               (1 << ((byte)lVar5 & 0x1f) & -(subm & 1));
          w[lVar5] = subw[0];
          w[uVar1] = subw[1];
          w[projectorigin::imd3[uVar1]] = 0.0;
          w[3] = subw[2];
          local_d0 = bVar7;
        }
      }
      pUVar4 = pUVar4 + 1;
      a_00 = a_00 + 1;
    }
    if (local_d0 < 0.0) {
      *m = 0xf;
      bVar7 = det(c,b,d);
      *w = bVar7 / bVar6;
      bVar7 = det(a,c,d);
      w[1] = bVar7 / bVar6;
      bVar7 = det(b,a,d);
      w[2] = bVar7 / bVar6;
      w[3] = 1.0 - (*w + w[1] + bVar7 / bVar6);
      local_d0 = 0.0;
    }
  }
  return local_d0;
}

Assistant:

static btScalar		projectorigin(	const btVector3& a,
				const btVector3& b,
				const btVector3& c,
				const btVector3& d,
				btScalar* w,U& m)
			{
				static const U		imd3[]={1,2,0};
				const btVector3*	vt[]={&a,&b,&c,&d};
				const btVector3		dl[]={a-d,b-d,c-d};
				const btScalar		vl=det(dl[0],dl[1],dl[2]);
				const bool			ng=(vl*btDot(a,btCross(b-c,a-b)))<=0;
				if(ng&&(btFabs(vl)>GJK_SIMPLEX4_EPS))
				{
					btScalar	mindist=-1;
					btScalar	subw[3]={0.f,0.f,0.f};
					U			subm(0);
					for(U i=0;i<3;++i)
					{
						const U			j=imd3[i];
						const btScalar	s=vl*btDot(d,btCross(dl[i],dl[j]));
						if(s>0)
						{
							const btScalar	subd=projectorigin(*vt[i],*vt[j],d,subw,subm);
							if((mindist<0)||(subd<mindist))
							{
								mindist		=	subd;
								m			=	static_cast<U>((subm&1?1<<i:0)+
									(subm&2?1<<j:0)+
									(subm&4?8:0));
								w[i]		=	subw[0];
								w[j]		=	subw[1];
								w[imd3[j]]	=	0;
								w[3]		=	subw[2];
							}
						}
					}
					if(mindist<0)
					{
						mindist	=	0;
						m		=	15;
						w[0]	=	det(c,b,d)/vl;
						w[1]	=	det(a,c,d)/vl;
						w[2]	=	det(b,a,d)/vl;
						w[3]	=	1-(w[0]+w[1]+w[2]);
					}
					return(mindist);
				}
				return(-1);
			}